

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

bool __thiscall
slang::parsing::Parser::
parseCaseItems<slang::parsing::Parser::parseCaseStatement(slang::syntax::NamedLabelSyntax*,std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>,slang::parsing::Token,slang::parsing::Token)::__2,slang::parsing::Parser::parseCaseStatement(slang::syntax::NamedLabelSyntax*,std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>,slang::parsing::Token,slang::parsing::Token)::__3>
          (Parser *this,TokenKind caseKind,
          SmallVectorBase<slang::syntax::CaseItemSyntax_*> *itemBuffer,
          anon_class_1_0_00000001 *isItem,anon_class_8_1_8991fb9c *parseItem)

{
  string_view arg;
  bool bVar1;
  bool bVar2;
  enable_if_t<is_constructible_v<decay_t<const_DiagCode_&>,_const_slang::DiagCode_&>,_optional<decay_t<const_DiagCode_&>_>_>
  eVar3;
  Diagnostic *pDVar4;
  SourceLocation in_RDX;
  Token TVar5;
  Token TVar6;
  anon_class_8_1_8991fb9c *in_stack_000000a0;
  Diagnostic *diag;
  TokenKind kind;
  Token current;
  bool errored;
  SourceLocation lastDefault;
  undefined6 in_stack_fffffffffffffee8;
  TokenKind in_stack_fffffffffffffeee;
  SourceLocation in_stack_fffffffffffffef0;
  SourceLocation in_stack_fffffffffffffef8;
  _Storage<slang::DiagCode,_true> local_e6;
  undefined2 local_e2;
  _Storage<slang::DiagCode,_true> local_e0;
  undefined2 local_dc;
  _Storage<slang::DiagCode,_true> local_d6;
  undefined2 local_d2;
  Diagnostic *in_stack_ffffffffffffff30;
  Info *in_stack_ffffffffffffff38;
  Parser *in_stack_ffffffffffffff40;
  Token in_stack_ffffffffffffff50;
  SourceLocation in_stack_ffffffffffffff60;
  DiagCode DVar7;
  Token local_78;
  SourceLocation local_68;
  undefined4 local_5c;
  Diagnostic *local_58;
  TokenKind local_4a;
  SourceLocation local_30 [3];
  SourceLocation local_18;
  
  local_18 = in_RDX;
  SourceLocation::SourceLocation(local_30);
  bVar1 = false;
  while( true ) {
    while( true ) {
      while( true ) {
        TVar5 = ParserBase::peek((ParserBase *)
                                 CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8));
        DVar7 = in_stack_ffffffffffffff60._4_4_;
        local_4a = TVar5.kind;
        if (local_4a != DefaultKeyword) break;
        bVar2 = SourceLocation::operator_cast_to_bool((SourceLocation *)0x8f6e1b);
        if ((bVar2) && (bVar1 == false)) {
          local_5c = 0x7f0005;
          local_78 = ParserBase::peek((ParserBase *)
                                      CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8))
          ;
          local_68 = Token::location(&local_78);
          pDVar4 = ParserBase::addDiag(in_stack_ffffffffffffff50._0_8_,DVar7,
                                       (SourceLocation)in_stack_ffffffffffffff50.info);
          local_58 = pDVar4;
          LexerFacts::getTokenKindText(in_stack_fffffffffffffef0._6_2_);
          DVar7 = SUB84((ulong)pDVar4 >> 0x20,0);
          arg._M_str = (char *)in_stack_ffffffffffffff40;
          arg._M_len = (size_t)in_stack_ffffffffffffff38;
          Diagnostic::operator<<(in_stack_ffffffffffffff30,arg);
          Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffffef0,DVar7,
                              in_stack_fffffffffffffef8);
          bVar1 = true;
        }
        in_stack_ffffffffffffff50 =
             ParserBase::peek((ParserBase *)
                              CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8));
        in_stack_ffffffffffffff60 = Token::location((Token *)&stack0xffffffffffffff50);
        in_stack_fffffffffffffef8 = local_18;
        local_30[0] = in_stack_ffffffffffffff60;
        parseDefaultCaseItem(in_stack_ffffffffffffff40);
        SmallVectorBase<slang::syntax::CaseItemSyntax_*>::push_back
                  ((SmallVectorBase<slang::syntax::CaseItemSyntax_*> *)in_stack_fffffffffffffef0,
                   (CaseItemSyntax **)CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8))
        ;
      }
      bVar2 = parseCaseStatement(slang::syntax::NamedLabelSyntax*,std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>,slang::parsing::Token,slang::parsing::Token)
              ::$_2::operator()((anon_class_1_0_00000001 *)in_stack_fffffffffffffef0,
                                in_stack_fffffffffffffeee);
      if (!bVar2) break;
      in_stack_fffffffffffffef0 = local_18;
      in_stack_ffffffffffffff40 =
           (Parser *)parseCaseStatement::anon_class_8_1_8991fb9c::operator()(in_stack_000000a0);
      SmallVectorBase<slang::syntax::CaseItemSyntax_*>::push_back
                ((SmallVectorBase<slang::syntax::CaseItemSyntax_*> *)in_stack_fffffffffffffef0,
                 (CaseItemSyntax **)CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8));
      TVar6 = ParserBase::peek((ParserBase *)
                               CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8));
      in_stack_ffffffffffffff30 = TVar6._0_8_;
      in_stack_ffffffffffffff38 = TVar6.info;
      bVar2 = Token::operator==((Token *)&stack0xffffffffffffffb8,(Token *)&stack0xffffffffffffff30)
      ;
      if (bVar2) {
        std::optional<slang::DiagCode>::optional((optional<slang::DiagCode> *)&local_d6);
        local_dc = local_d2;
        local_e0 = local_d6;
        ParserBase::skipToken
                  (TVar5._0_8_,(_Optional_base<slang::DiagCode,_true,_true>)TVar5.info._2_6_);
      }
    }
    if ((local_4a == EndOfFile) ||
       (bVar2 = slang::syntax::SyntaxFacts::isEndKeyword(local_4a), bVar2)) break;
    if (bVar1 == false) {
      eVar3 = std::make_optional<slang::DiagCode_const&>
                        ((DiagCode *)CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8));
      local_e6 = eVar3.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
                 super__Optional_payload_base<slang::DiagCode>._M_payload;
      local_e2 = eVar3.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
                 super__Optional_payload_base<slang::DiagCode>._4_2_;
    }
    else {
      std::optional<slang::DiagCode>::optional((optional<slang::DiagCode> *)&local_e6);
    }
    ParserBase::skipToken(TVar5._0_8_,(_Optional_base<slang::DiagCode,_true,_true>)TVar5.info._2_6_)
    ;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool Parser::parseCaseItems(TokenKind caseKind, SmallVectorBase<CaseItemSyntax*>& itemBuffer,
                            IsItemFunc&& isItem, ParseItemFunc&& parseItem) {
    SourceLocation lastDefault;
    bool errored = false;

    while (true) {
        auto current = peek();
        auto kind = current.kind;
        if (kind == TokenKind::DefaultKeyword) {
            if (lastDefault && !errored) {
                auto& diag = addDiag(diag::MultipleDefaultCases, peek().location());
                diag << LexerFacts::getTokenKindText(caseKind);
                diag.addNote(diag::NotePreviousDefinition, lastDefault);
                errored = true;
            }

            lastDefault = peek().location();
            itemBuffer.push_back(&parseDefaultCaseItem());
        }
        else if (isItem(kind)) {
            itemBuffer.push_back(parseItem());
            if (current == peek()) {
                // parseItem() didn't consume any tokens, so we'll be stuck
                // in an infinite loop if we don't skip a token here.
                skipToken(std::nullopt);
            }
        }
        else if (kind == TokenKind::EndOfFile || isEndKeyword(kind)) {
            break;
        }
        else {
            // no idea what this is; skip it
            skipToken(errored ? std::nullopt : std::make_optional(diag::ExpectedCaseItem));
            errored = true;
        }
    }

    return errored;
}